

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O2

void __thiscall MeCab::Mmap<char>::~Mmap(Mmap<char> *this)

{
  ~Mmap(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Mmap() { this->close(); }